

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

void __thiscall QDockAreaLayout::QDockAreaLayout(QDockAreaLayout *this,QMainWindow *win)

{
  int *piVar1;
  int iVar2;
  QStyle *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->rect).x1 = 0;
  (this->rect).y1 = 0;
  (this->rect).x2 = -1;
  (this->rect).y2 = -1;
  (this->centralWidgetRect).x1 = 0;
  (this->centralWidgetRect).y1 = 0;
  (this->centralWidgetRect).x2 = -1;
  (this->centralWidgetRect).y2 = -1;
  lVar4 = 0x40;
  do {
    QDockAreaLayoutInfo::QDockAreaLayoutInfo((QDockAreaLayoutInfo *)((long)this->corners + lVar4));
    lVar4 = lVar4 + 0x70;
  } while (lVar4 != 0x200);
  this->fallbackToSizeHints = true;
  (this->separatorWidgets).d.d = (Data *)0x0;
  (this->separatorWidgets).d.ptr = (QWidget **)0x0;
  (this->separatorWidgets).d.size = 0;
  this->mainWindow = win;
  pQVar3 = QWidget::style(&win->super_QWidget);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x10,0,win);
  piVar1 = &this->sep;
  this->sep = iVar2;
  local_a8.separatorWidgets.d.d = (Data *)0x0;
  local_a8.separatorWidgets.d.ptr._0_4_ = 0;
  local_a8.separatorWidgets.d.ptr._4_4_ = 0;
  local_a8.separatorWidgets.d.size._0_4_ = 0;
  local_a8.separatorWidgets.d.size._4_4_ = 0;
  local_a8.dockPos = LeftDock;
  local_a8.o = Vertical;
  local_a8.rect.x1.m_i = 0;
  local_a8.rect.y1.m_i = 0;
  local_a8.rect.x2.m_i = -1;
  local_a8.rect.y2.m_i = -1;
  local_a8.tabBar = (QTabBar *)0x0;
  local_a8.item_list.d.d = (Data *)0x0;
  local_a8.item_list.d.ptr._0_1_ = 0;
  local_a8.item_list.d.ptr._1_7_ = 0;
  local_a8.item_list.d.size._0_1_ = 0;
  local_a8._81_8_ = 0;
  iVar2 = 1;
  local_a8.sep = piVar1;
  local_a8.mainWindow = win;
  local_a8.tabBarShape = iVar2;
  QDockAreaLayoutInfo::operator=(this->docks,&local_a8);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo(&local_a8);
  local_a8.separatorWidgets.d.d = (Data *)0x0;
  local_a8.separatorWidgets.d.ptr._0_4_ = 0;
  local_a8.separatorWidgets.d.ptr._4_4_ = 0;
  local_a8.separatorWidgets.d.size._0_4_ = 0;
  local_a8.separatorWidgets.d.size._4_4_ = 0;
  local_a8.dockPos = RightDock;
  local_a8.o = Vertical;
  local_a8.rect.x1.m_i = 0;
  local_a8.rect.y1.m_i = 0;
  local_a8.rect.x2.m_i = -1;
  local_a8.rect.y2.m_i = -1;
  local_a8.tabBar = (QTabBar *)0x0;
  local_a8.item_list.d.d = (Data *)0x0;
  local_a8.item_list.d.ptr._0_1_ = 0;
  local_a8.item_list.d.ptr._1_7_ = 0;
  local_a8.item_list.d.size._0_1_ = 0;
  local_a8._81_8_ = 0;
  local_a8.sep = piVar1;
  local_a8.mainWindow = win;
  local_a8.tabBarShape = iVar2;
  QDockAreaLayoutInfo::operator=(this->docks + 1,&local_a8);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo(&local_a8);
  local_a8.separatorWidgets.d.d = (Data *)0x0;
  local_a8.separatorWidgets.d.ptr._0_4_ = 0;
  local_a8.separatorWidgets.d.ptr._4_4_ = 0;
  local_a8.separatorWidgets.d.size._0_4_ = 0;
  local_a8.separatorWidgets.d.size._4_4_ = 0;
  local_a8.dockPos = TopDock;
  local_a8.o = Horizontal;
  local_a8.rect.x1.m_i = 0;
  local_a8.rect.y1.m_i = 0;
  local_a8.rect.x2.m_i = -1;
  local_a8.rect.y2.m_i = -1;
  local_a8.tabBar = (QTabBar *)0x0;
  local_a8.item_list.d.d = (Data *)0x0;
  local_a8.item_list.d.ptr._0_1_ = 0;
  local_a8.item_list.d.ptr._1_7_ = 0;
  local_a8.item_list.d.size._0_1_ = 0;
  local_a8._81_8_ = 0;
  local_a8.sep = piVar1;
  local_a8.mainWindow = win;
  local_a8.tabBarShape = iVar2;
  QDockAreaLayoutInfo::operator=(this->docks + 2,&local_a8);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo(&local_a8);
  local_a8.separatorWidgets.d.d = (Data *)0x0;
  local_a8.separatorWidgets.d.ptr._0_4_ = 0;
  local_a8.separatorWidgets.d.ptr._4_4_ = 0;
  local_a8.separatorWidgets.d.size._0_4_ = 0;
  local_a8.separatorWidgets.d.size._4_4_ = 0;
  local_a8.dockPos = BottomDock;
  local_a8.o = Horizontal;
  local_a8.rect.x1.m_i = 0;
  local_a8.rect.y1.m_i = 0;
  local_a8.rect.x2.m_i = -1;
  local_a8.rect.y2.m_i = -1;
  local_a8.tabBar = (QTabBar *)0x0;
  local_a8.item_list.d.d = (Data *)0x0;
  local_a8.item_list.d.ptr._0_1_ = 0;
  local_a8.item_list.d.ptr._1_7_ = 0;
  local_a8.item_list.d.size._0_1_ = 0;
  local_a8._81_8_ = 0;
  local_a8.sep = piVar1;
  local_a8.mainWindow = win;
  local_a8.tabBarShape = iVar2;
  QDockAreaLayoutInfo::operator=(this->docks + 3,&local_a8);
  QDockAreaLayoutInfo::~QDockAreaLayoutInfo(&local_a8);
  this->centralWidgetItem = (QLayoutItem *)0x0;
  this->corners[0] = TopDockWidgetArea;
  this->corners[1] = TopDockWidgetArea;
  this->corners[2] = BottomDockWidgetArea;
  this->corners[3] = BottomDockWidgetArea;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDockAreaLayout::QDockAreaLayout(QMainWindow *win) : fallbackToSizeHints(true)
{
    mainWindow = win;
    sep = win->style()->pixelMetric(QStyle::PM_DockWidgetSeparatorExtent, nullptr, win);
#if QT_CONFIG(tabbar)
    const int tabShape = QTabBar::RoundedSouth;
#else
    const int tabShape = 0;
#endif
    docks[QInternal::LeftDock]
        = QDockAreaLayoutInfo(&sep, QInternal::LeftDock, Qt::Vertical, tabShape, win);
    docks[QInternal::RightDock]
        = QDockAreaLayoutInfo(&sep, QInternal::RightDock, Qt::Vertical, tabShape, win);
    docks[QInternal::TopDock]
        = QDockAreaLayoutInfo(&sep, QInternal::TopDock, Qt::Horizontal, tabShape, win);
    docks[QInternal::BottomDock]
        = QDockAreaLayoutInfo(&sep, QInternal::BottomDock, Qt::Horizontal, tabShape, win);
    centralWidgetItem = nullptr;


    corners[Qt::TopLeftCorner] = Qt::TopDockWidgetArea;
    corners[Qt::TopRightCorner] = Qt::TopDockWidgetArea;
    corners[Qt::BottomLeftCorner] = Qt::BottomDockWidgetArea;
    corners[Qt::BottomRightCorner] = Qt::BottomDockWidgetArea;
}